

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

pair<unsigned_long,_duckdb::hugeint_t> * __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
::_Pool::Release(pair<unsigned_long,_duckdb::hugeint_t> *__return_storage_ptr__,_Pool *this,
                Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                *pNode)

{
  Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  *pNVar1;
  pointer pNVar2;
  uint64_t uVar3;
  
  (__return_storage_ptr__->second).upper = (pNode->_value).second.upper;
  uVar3 = (pNode->_value).second.lower;
  __return_storage_ptr__->first = (pNode->_value).first;
  (__return_storage_ptr__->second).lower = uVar3;
  pNVar1 = this->cache;
  this->cache = pNode;
  if ((pNVar1 != (Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
                  *)0x0) &&
     (pNVar2 = (pNVar1->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start, pNVar2 != (pointer)0x0)) {
    operator_delete(pNVar2);
  }
  operator_delete(pNVar1);
  return __return_storage_ptr__;
}

Assistant:

T Release(Node *pNode) {
			T result = pNode->value();
			std::swap(pNode, cache);
			delete pNode;
			return result;
		}